

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDValidator.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::DTDValidator::checkContent
          (DTDValidator *this,XMLElementDecl *elemDecl,QName **children,XMLSize_t childCount,
          XMLSize_t *indexFailingChild)

{
  uint uVar1;
  XMLScanner *pXVar2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  undefined4 extraout_var;
  RuntimeException *this_00;
  
  if (elemDecl == (XMLElementDecl *)0x0) {
    this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDValidator.cpp"
               ,0x40,Val_InvalidElemId,((this->super_XMLValidator).fScanner)->fMemoryManager);
LAB_0030f07f:
    __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
  }
  uVar1 = *(uint *)&elemDecl->field_0x2c;
  bVar3 = true;
  if (uVar1 != 1) {
    if (uVar1 != 0) {
      if ((uVar1 & 0xfffffffe) == 2) {
        iVar5 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[0xb])(elemDecl);
        pXVar2 = (this->super_XMLValidator).fScanner;
        uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x10))
                          ((long *)CONCAT44(extraout_var,iVar5),children,childCount,
                           pXVar2->fEmptyNamespaceId,indexFailingChild,pXVar2->fMemoryManager);
        return (bool)uVar4;
      }
      this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
      RuntimeException::RuntimeException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDValidator.cpp"
                 ,99,CM_UnknownCMType,((this->super_XMLValidator).fScanner)->fMemoryManager);
      goto LAB_0030f07f;
    }
    if (childCount != 0) {
      *indexFailingChild = 0;
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool DTDValidator::checkContent(XMLElementDecl* const elemDecl
                              , QName** const         children
                              , XMLSize_t             childCount
                              , XMLSize_t*         indexFailingChild)
{
    //
    //  Look up the element id in our element decl pool. This will get us
    //  the element decl in our own way of looking at them.
    //
    if (!elemDecl)
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Val_InvalidElemId, getScanner()->getMemoryManager());

    //
    //  Get the content spec type of this element. This will tell us what
    //  to do to validate it.
    //
    const DTDElementDecl::ModelTypes modelType = ((DTDElementDecl*) elemDecl)->getModelType();

    if (modelType == DTDElementDecl::Empty)
    {
        //
        //  We can do this one here. It cannot have any children. If it does
        //  we return 0 as the index of the first bad child.
        //
        if (childCount)
        {
            *indexFailingChild=0;
            return false;
        }
    }
     else if (modelType == DTDElementDecl::Any)
    {
        // We pass no judgement on this one, anything goes
    }
     else if ((modelType == DTDElementDecl::Mixed_Simple)
          ||  (modelType == DTDElementDecl::Children))
    {
        // Get the element's content model or fault it in
        const XMLContentModel* elemCM = elemDecl->getContentModel();

        // Ask it to validate and return its return
        return elemCM->validateContent(children, childCount, getScanner()->getEmptyNamespaceId(), indexFailingChild, getScanner()->getMemoryManager());
    }
     else
    {
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMType, getScanner()->getMemoryManager());
    }

    // Went ok, so return success
    return true;
}